

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandShortNames(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Wlc_Ntk_t *p;
  char *pcVar3;
  int fVerbose;
  int c;
  Wlc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p = Wlc_AbcGetNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar2 == -1) {
      if (p == (Wlc_Ntk_t *)0x0) {
        Abc_Print(1,"Abc_CommandProfile(): There is no current design.\n");
      }
      else {
        Wlc_NtkShortNames(p);
      }
      return 0;
    }
    if ((iVar2 == 0x68) || (iVar2 != 0x76)) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  Abc_Print(-2,"usage: %%short_names [-vh]\n");
  Abc_Print(-2,"\t         derives short names for all objects of the network\n");
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandShortNames( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    Abc_NtkShortNames( pNtk );
    return 0;

usage:
    Abc_Print( -2, "usage: short_names [-h]\n" );
    Abc_Print( -2, "\t         replaces PI/PO/latch names by short char strings\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}